

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

ColorEncodingHandle pbrt::ColorEncodingHandle::Get(string *name)

{
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  iterator iVar4;
  GammaColorEncoding *this;
  mapped_type *pmVar5;
  char *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  uintptr_t iptr;
  double dVar6;
  string_view str;
  Float gamma;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  float local_44;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  bVar1 = std::operator==(in_RSI,"linear");
  pcVar3 = Linear;
  if ((bVar1) || (bVar1 = std::operator==(in_RSI,"sRGB"), pcVar3 = sRGB, bVar1)) {
    (name->_M_dataplus)._M_p = pcVar3;
  }
  else {
    if ((Get(std::__cxx11::string_const&)::cache == '\0') &&
       (iVar2 = __cxa_guard_acquire(&Get(std::__cxx11::string_const&)::cache), iVar2 != 0)) {
      Get::cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      Get::cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      Get::cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &Get::cache._M_t._M_impl.super__Rb_tree_header._M_header;
      Get::cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &Get::cache._M_t._M_impl.super__Rb_tree_header._M_header;
      Get::cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      __cxa_atexit(std::
                   map<float,_pbrt::ColorEncodingHandle,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>_>
                   ::~map,&Get::cache,&__dso_handle);
      __cxa_guard_release(&Get(std::__cxx11::string_const&)::cache);
    }
    str._M_str = in_RCX;
    str._M_len = (size_t)(in_RSI->_M_dataplus)._M_p;
    SplitStringsFromWhitespace_abi_cxx11_(&local_40,(pbrt *)in_RSI->_M_string_length,str);
    if (((long)local_40.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_40.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start != 0x40) ||
       (bVar1 = std::operator!=(local_40.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,"gamma"), bVar1)) {
      ErrorExit<std::__cxx11::string_const&>
                ("%s: expected \"gamma <value>\" for color encoding",in_RSI);
    }
    dVar6 = atof(local_40.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    local_44 = (float)dVar6;
    if ((local_44 == 0.0) && (!NAN(local_44))) {
      ErrorExit<std::__cxx11::string&>
                ("%s: unable to parse gamma value",
                 local_40.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    iVar4 = std::
            _Rb_tree<float,_std::pair<const_float,_pbrt::ColorEncodingHandle>,_std::_Select1st<std::pair<const_float,_pbrt::ColorEncodingHandle>_>,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>_>
            ::find(&Get::cache._M_t,&local_44);
    if ((_Rb_tree_header *)iVar4._M_node == &Get::cache._M_t._M_impl.super__Rb_tree_header) {
      this = (GammaColorEncoding *)operator_new(0x1404);
      GammaColorEncoding::GammaColorEncoding(this,local_44);
      (name->_M_dataplus)._M_p = (pointer)((ulong)this | 0x3000000000000);
      pmVar5 = std::
               map<float,_pbrt::ColorEncodingHandle,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>_>
               ::operator[](&Get::cache,&local_44);
      (pmVar5->
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      ).bits = (uintptr_t)((ulong)this | 0x3000000000000);
      if (LOGGING_LogLevel < 1) {
        Log<std::__cxx11::string_const&,float&,pbrt::ColorEncodingHandle&>
                  (Verbose,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/color.cpp"
                   ,0xed,"Added ColorEncoding %s for gamma %f -> %s",in_RSI,&local_44,
                   (ColorEncodingHandle *)name);
      }
    }
    else {
      (name->_M_dataplus)._M_p = (pointer)iVar4._M_node[1]._M_parent;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
  }
  return (ColorEncodingHandle)
         (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )name;
}

Assistant:

const ColorEncodingHandle ColorEncodingHandle::Get(const std::string &name) {
    if (name == "linear")
        return Linear;
    else if (name == "sRGB")
        return sRGB;
    else {
        static std::map<float, ColorEncodingHandle> cache;

        std::vector<std::string> params = SplitStringsFromWhitespace(name);
        if (params.size() != 2 || params[0] != "gamma")
            ErrorExit("%s: expected \"gamma <value>\" for color encoding", name);
        Float gamma = atof(params[1].c_str());
        if (gamma == 0)
            ErrorExit("%s: unable to parse gamma value", params[1]);

        auto iter = cache.find(gamma);
        if (iter != cache.end())
            return iter->second;

        ColorEncodingHandle enc = new GammaColorEncoding(gamma);
        cache[gamma] = enc;
        LOG_VERBOSE("Added ColorEncoding %s for gamma %f -> %s", name, gamma, enc);
        return enc;
    }
}